

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O2

bool __thiscall
cmCMakePresetsGraphInternal::InListCondition::Evaluate
          (InListCondition *this,
          vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
          *expanders,int version,optional<bool> *out)

{
  pointer pbVar1;
  bool bVar2;
  __type _Var3;
  ExpandMacroResult EVar4;
  pointer pbVar5;
  byte bVar6;
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> item;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_70,(string *)&this->String);
  EVar4 = anon_unknown.dwarf_1710cb::ExpandMacros(&local_70,expanders,version);
  if (EVar4 == Ignore) {
    bVar6 = 1;
    if ((out->super__Optional_base<bool,_true,_true>)._M_payload.super__Optional_payload_base<bool>.
        _M_engaged == true) {
      (out->super__Optional_base<bool,_true,_true>)._M_payload.super__Optional_payload_base<bool>.
      _M_engaged = false;
    }
  }
  else if (EVar4 == Error) {
    bVar6 = 0;
  }
  else {
    pbVar5 = (this->List).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (this->List).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    do {
      if (pbVar5 == pbVar1) {
        (out->super__Optional_base<bool,_true,_true>)._M_payload.super__Optional_payload_base<bool>
             = (_Optional_payload_base<bool>)0x100;
        bVar6 = 1;
        break;
      }
      std::__cxx11::string::string((string *)&local_50,(string *)pbVar5);
      EVar4 = anon_unknown.dwarf_1710cb::ExpandMacros(&local_50,expanders,version);
      if (EVar4 == Ignore) {
        if ((out->super__Optional_base<bool,_true,_true>)._M_payload.
            super__Optional_payload_base<bool>._M_engaged == true) {
          (out->super__Optional_base<bool,_true,_true>)._M_payload.
          super__Optional_payload_base<bool>._M_engaged = false;
        }
LAB_00185f73:
        this = (InListCondition *)0x1;
        bVar2 = false;
      }
      else if (EVar4 == Error) {
        bVar2 = false;
        this = (InListCondition *)0x0;
      }
      else {
        _Var3 = std::operator==(&local_70,&local_50);
        bVar2 = true;
        if (_Var3) {
          (out->super__Optional_base<bool,_true,_true>)._M_payload.
          super__Optional_payload_base<bool> = (_Optional_payload_base<bool>)0x101;
          goto LAB_00185f73;
        }
      }
      bVar6 = (byte)this;
      std::__cxx11::string::~string((string *)&local_50);
      pbVar5 = pbVar5 + 1;
    } while (bVar2);
  }
  std::__cxx11::string::~string((string *)&local_70);
  return (bool)(bVar6 & 1);
}

Assistant:

bool cmCMakePresetsGraphInternal::InListCondition::Evaluate(
  const std::vector<MacroExpander>& expanders, int version,
  cm::optional<bool>& out) const
{
  std::string str = this->String;
  CHECK_EXPAND(out, str, expanders, version);

  for (auto item : this->List) {
    CHECK_EXPAND(out, item, expanders, version);
    if (str == item) {
      out = true;
      return true;
    }
  }

  out = false;
  return true;
}